

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall optCompare_bothNotEmptyLess_Test::TestBody(optCompare_bothNotEmptyLess_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper AStack_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  opt_int i2;
  opt_int i1;
  string local_40;
  AssertionResult gtest_ar_;
  
  local_40._M_dataplus._M_p._0_4_ = 1;
  mp::opt<int,_mp::opt_null_value_policy<int,_-1>_>::opt<int,_true,_true>(&i1,(int *)&local_40);
  local_40._M_dataplus._M_p._0_4_ = 2;
  mp::opt<int,_mp::opt_null_value_policy<int,_-1>_>::opt<int,_true,_true>(&i2,(int *)&local_40);
  bVar1 = mp::operator==(&i1,&i2);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"i1 == i2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x3b1,(char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                      local_40._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = mp::operator!=(&i1,&i2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"i1 != i2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x3b2,(char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                      local_40._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = mp::operator<(&i1,&i2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"i1 < i2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x3b3,(char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                      local_40._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = mp::operator<(&i2,&i1);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"i1 > i2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x3b4,(char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                      local_40._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = mp::operator<=(&i1,&i2);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"i1 <= i2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x3b5,(char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                      local_40._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = mp::operator>=(&i1,&i2);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"i1 >= i2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x3b6,(char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                      local_40._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(optCompare, bothNotEmptyLess)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i1{1}, i2{2};
  EXPECT_FALSE(i1 == i2);
  EXPECT_TRUE(i1 != i2);
  EXPECT_TRUE(i1 < i2);
  EXPECT_FALSE(i1 > i2);
  EXPECT_TRUE(i1 <= i2);
  EXPECT_FALSE(i1 >= i2);
}